

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.hpp
# Opt level: O0

string * bitstring<(unsigned_char)3,(unsigned_char)2>
                   (flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x02_> *ff)

{
  string *in_RDI;
  stringstream buffer;
  stringstream local_198 [16];
  undefined1 local_188 [16];
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x02_> *in_stack_fffffffffffffe88;
  ostream *in_stack_fffffffffffffe90;
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::ostream::operator<<(local_188,flexfloat_as_bits);
  operator<<(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string bitstring(const flexfloat<e, f> &ff) noexcept
{
    std::stringstream buffer;
    buffer << flexfloat_as_bits << ff;
    return buffer.str();
}